

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int backupOnePage(sqlite3_backup *p,Pgno iSrcPg,u8 *zSrcData,int bUpdate)

{
  u32 uVar1;
  BtShared *pBVar2;
  Pager *pPVar3;
  u32 uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  void *__dest;
  long in_FS_OFFSET;
  DbPage *pDestPg;
  DbPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = p->pSrc->pBt->pageSize;
  lVar6 = (long)(int)uVar1;
  if (lVar6 < 1) {
    iVar5 = 0;
  }
  else {
    pBVar2 = p->pDest->pBt;
    pPVar3 = pBVar2->pPager;
    lVar9 = (ulong)iSrcPg * lVar6 - lVar6;
    uVar4 = pBVar2->pageSize;
    lVar8 = (long)(int)uVar4;
    if ((int)uVar1 < (int)uVar4) {
      uVar4 = uVar1;
    }
    do {
      local_40 = (PgHdr *)0x0;
      iVar5 = 0;
      uVar7 = (uint)(lVar9 / lVar8);
      if ((uint)sqlite3PendingByte / p->pDest->pBt->pageSize != uVar7) {
        iVar5 = (*pPVar3->xGet)(pPVar3,uVar7 + 1,&local_40,0);
        if ((iVar5 == 0) && (iVar5 = sqlite3PagerWrite(local_40), iVar5 == 0)) {
          __dest = (void *)(lVar9 % lVar8 + (long)local_40->pData);
          memcpy(__dest,zSrcData + lVar9 % lVar6,(long)(int)uVar4);
          iVar5 = 0;
          *(undefined1 *)local_40->pExtra = 0;
          if ((bUpdate == 0) && (lVar9 == 0)) {
            uVar7 = p->pSrc->pBt->nPage;
            *(uint *)((long)__dest + 0x1c) =
                 uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          }
        }
        if (local_40 != (DbPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_40);
        }
      }
    } while ((iVar5 == 0) && (lVar9 = lVar9 + lVar8, lVar9 < (long)((ulong)iSrcPg * lVar6)));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int backupOnePage(
  sqlite3_backup *p,              /* Backup handle */
  Pgno iSrcPg,                    /* Source database page to backup */
  const u8 *zSrcData,             /* Source database page data */
  int bUpdate                     /* True for an update, false otherwise */
){
  Pager * const pDestPager = sqlite3BtreePager(p->pDest);
  const int nSrcPgsz = sqlite3BtreeGetPageSize(p->pSrc);
  int nDestPgsz = sqlite3BtreeGetPageSize(p->pDest);
  const int nCopy = MIN(nSrcPgsz, nDestPgsz);
  const i64 iEnd = (i64)iSrcPg*(i64)nSrcPgsz;
  int rc = SQLITE_OK;
  i64 iOff;

  assert( sqlite3BtreeGetReserveNoMutex(p->pSrc)>=0 );
  assert( p->bDestLocked );
  assert( !isFatalError(p->rc) );
  assert( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) );
  assert( zSrcData );
  assert( nSrcPgsz==nDestPgsz || sqlite3PagerIsMemdb(pDestPager)==0 );

  /* This loop runs once for each destination page spanned by the source
  ** page. For each iteration, variable iOff is set to the byte offset
  ** of the destination page.
  */
  for(iOff=iEnd-(i64)nSrcPgsz; rc==SQLITE_OK && iOff<iEnd; iOff+=nDestPgsz){
    DbPage *pDestPg = 0;
    Pgno iDest = (Pgno)(iOff/nDestPgsz)+1;
    if( iDest==PENDING_BYTE_PAGE(p->pDest->pBt) ) continue;
    if( SQLITE_OK==(rc = sqlite3PagerGet(pDestPager, iDest, &pDestPg, 0))
     && SQLITE_OK==(rc = sqlite3PagerWrite(pDestPg))
    ){
      const u8 *zIn = &zSrcData[iOff%nSrcPgsz];
      u8 *zDestData = sqlite3PagerGetData(pDestPg);
      u8 *zOut = &zDestData[iOff%nDestPgsz];

      /* Copy the data from the source page into the destination page.
      ** Then clear the Btree layer MemPage.isInit flag. Both this module
      ** and the pager code use this trick (clearing the first byte
      ** of the page 'extra' space to invalidate the Btree layers
      ** cached parse of the page). MemPage.isInit is marked
      ** "MUST BE FIRST" for this purpose.
      */
      memcpy(zOut, zIn, nCopy);
      ((u8 *)sqlite3PagerGetExtra(pDestPg))[0] = 0;
      if( iOff==0 && bUpdate==0 ){
        sqlite3Put4byte(&zOut[28], sqlite3BtreeLastPage(p->pSrc));
      }
    }
    sqlite3PagerUnref(pDestPg);
  }

  return rc;
}